

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

int Lf_CutCreateUnit(Lf_Cut_t *p,int i)

{
  int i_local;
  Lf_Cut_t *p_local;
  
  *(uint *)&p->field_0x14 = *(uint *)&p->field_0x14 & 0xffbfffff;
  *(uint *)&p->field_0x14 = *(uint *)&p->field_0x14 & 0xff7fffff;
  p->iFunc = 2;
  *(uint *)&p->field_0x14 = *(uint *)&p->field_0x14 & 0xffffff | 0x1000000;
  *(int *)&p[1].Sign = i;
  p->Sign = 1L << ((byte)i & 0x3f);
  return 1;
}

Assistant:

static inline int Lf_CutCreateUnit( Lf_Cut_t * p, int i )
{
    p->fLate = 0;
    p->fMux7 = 0;
    p->iFunc = 2;
    p->nLeaves = 1;
    p->pLeaves[0] = i;
    p->Sign = ((word)1) << (i & 0x3F);
    return 1;
}